

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostDetailsProvider.cpp
# Opt level: O1

bool __thiscall
FIX::HostDetailsProvider::populateHostDetails
          (HostDetailsProvider *this,int n,Dictionary *d,HostDetails *out)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uint __uval;
  uint __len;
  string suffix;
  string sourcePort;
  string port;
  string host;
  string sourceHost;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SocketConnectHost","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SocketConnectPort","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SocketConnectSourceHost","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SocketConnectSourcePort","");
  if (0 < n) {
    __len = 1;
    if (9 < (uint)n) {
      uVar2 = 4;
      uVar1 = n;
      do {
        __len = uVar2;
        if (uVar1 < 100) {
          __len = __len - 2;
          goto LAB_0017ab26;
        }
        if (uVar1 < 1000) {
          __len = __len - 1;
          goto LAB_0017ab26;
        }
        if (uVar1 < 10000) goto LAB_0017ab26;
        bVar3 = 99999 < uVar1;
        uVar2 = __len + 4;
        uVar1 = uVar1 / 10000;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_0017ab26:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_d0._M_dataplus._M_p,__len,n);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_d0._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = Dictionary::has(d,&local_70);
  if ((bVar3) && (bVar3 = Dictionary::has(d,&local_90), bVar3)) {
    Dictionary::getString(&local_d0,d,&local_70,false);
    std::__cxx11::string::operator=((string *)out,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    iVar4 = Dictionary::getInt(d,&local_90);
    out->port = (short)iVar4;
    bVar3 = Dictionary::has(d,&local_50);
    if (bVar3) {
      Dictionary::getString(&local_d0,d,&local_50,false);
      std::__cxx11::string::operator=((string *)&out->sourceAddress,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = Dictionary::has(d,&local_b0);
    bVar5 = true;
    if (bVar3) {
      iVar4 = Dictionary::getInt(d,&local_b0);
      out->sourcePort = (short)iVar4;
    }
  }
  else {
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool FIX::HostDetailsProvider::populateHostDetails(int n, const Dictionary &d, HostDetails &out) {
  std::string host = SOCKET_CONNECT_HOST;
  std::string port = SOCKET_CONNECT_PORT;
  std::string sourceHost = SOCKET_CONNECT_SOURCE_HOST;
  std::string sourcePort = SOCKET_CONNECT_SOURCE_PORT;

  if (n > 0) {
    std::string suffix = std::to_string(n);
    host += suffix;
    port += suffix;
    sourceHost += suffix;
    sourcePort += suffix;
  }

  if (d.has(host) && d.has(port)) {
    out.address = d.getString(host);
    out.port = (short)d.getInt(port);

    if (d.has(sourceHost)) {
      out.sourceAddress = d.getString(sourceHost);
    }

    if (d.has(sourcePort)) {
      out.sourcePort = (short)d.getInt(sourcePort);
    }

    return true;
  }
  return false;
}